

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::scan
               (Poppifier *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_Poppifier_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00815892:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_0081552f:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00815892;
    }
    local_38 = pEVar1 + 2;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_008153e0;
  case LoopId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00815892;
    }
    goto LAB_00815116;
  case BreakId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00815892;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00814d9b;
  case SwitchId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00815892;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x00814b4a;
  case CallId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00815892;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00815892;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00815892;
    }
    break;
  case LocalSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00815892;
    }
    goto LAB_0081550b;
  case GlobalGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00815892;
    }
    break;
  case GlobalSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00815892;
    }
    goto LAB_00815116;
  case LoadId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00815892;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00815519;
  case StoreId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00815892;
    }
    goto LAB_008151cd;
  case ConstId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00815892;
    }
    break;
  case UnaryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00815892;
    }
    goto LAB_0081550b;
  case BinaryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00815892;
    }
    goto LAB_0081545b;
  case SelectId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00815892;
    }
    goto LAB_00814e55;
  case DropId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case ReturnId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00815892;
    }
    goto LAB_00814b41;
  case MemorySizeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00815892;
    }
    break;
  case MemoryGrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case NopId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00815892;
    }
    break;
  case UnreachableId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00815892;
    }
    break;
  case AtomicRMWId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00815892;
    }
    goto LAB_008152b4;
  case AtomicCmpxchgId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00815892;
    }
    goto LAB_0081529a;
  case AtomicWaitId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00815892;
    }
    goto LAB_008149d8;
  case AtomicNotifyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00815892;
    }
    goto LAB_0081545b;
  case AtomicFenceId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00815892;
    }
    break;
  case SIMDExtractId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00815892;
    }
    goto LAB_0081550b;
  case SIMDReplaceId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00815892;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00815466;
  case SIMDShuffleId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00815892;
    }
    goto LAB_008153e0;
  case SIMDTernaryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00815892;
    }
    goto LAB_008149d8;
  case SIMDShiftId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00815892;
    }
    goto LAB_0081545b;
  case SIMDLoadId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00815892;
    }
    goto LAB_0081504b;
  case SIMDLoadStoreLaneId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00815892;
    }
LAB_008151cd:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00815519;
  case MemoryInitId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00815892;
    }
LAB_0081529a:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    goto LAB_008152b4;
  case DataDropId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00815892;
    }
    break;
  case MemoryCopyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00815892;
    }
    goto LAB_00814e55;
  case MemoryFillId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00815892;
    }
    goto LAB_00814e55;
  case PopId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00815892;
    }
    break;
  case RefNullId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00815892;
    }
    break;
  case RefIsNullId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case RefFuncId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00815892;
    }
    break;
  case RefEqId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00815892;
    }
    goto LAB_008153e0;
  case TableGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00815892;
    }
    goto LAB_00815116;
  case TableSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00815892;
    }
    goto LAB_008152b4;
  case TableSizeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00815892;
    }
    break;
  case TableGrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00815892;
    }
LAB_008152b4:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00815519;
  case TryId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00815892;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_00815116:
    pEVar1 = pEVar1 + 2;
    goto LAB_00815519;
  case ThrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00815892;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00815892;
    }
    break;
  case TupleMakeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00815892;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case I31NewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case I31GetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case CallRefId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00815892;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case RefCastId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case BrOnId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00815892;
    }
LAB_0081504b:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00815519;
  case StructNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00815892;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00815892;
    }
    goto LAB_0081550b;
  case StructSetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00815892;
    }
    goto LAB_0081545b;
  case ArrayNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00815892;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[1].type);
LAB_00814b41:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x00814b4a:
    if (lVar4 != 0) {
LAB_00814d9b:
      local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                 scan(Poppifier*,wasm::Expression___;
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_00815892;
    }
    goto LAB_00814be9;
  case ArrayNewFixedId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00815892;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0081552f;
        Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
                  ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
                   wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
                   scan(Poppifier*,wasm::Expression___,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00815892;
    }
    goto LAB_008153e0;
  case ArraySetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00815892;
    }
    goto LAB_00814e55;
  case ArrayLenId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00815892;
    }
    goto LAB_0081543a;
  case ArrayCopyId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00815892;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    goto LAB_0081497a;
  case ArrayFillId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00815892;
    }
LAB_0081497a:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[2].type);
    goto LAB_00814e55;
  case ArrayInitId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_00815892;
    }
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 4));
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[3].type);
LAB_00814be9:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00815519;
  case RefAsId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00815892;
    }
    goto LAB_0081550b;
  case StringNewId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00815892;
    }
    local_38 = pEVar1 + 3;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_0081550b;
  case StringConstId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00815892;
    }
    break;
  case StringMeasureId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00815892;
    }
    goto LAB_0081550b;
  case StringEncodeId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00815892;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,wasm::Visitor<wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>).
                     super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_0081545b;
  case StringConcatId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00815892;
    }
    goto LAB_008153e0;
  case StringEqId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00815892;
    }
    goto LAB_0081545b;
  case StringAsId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_00815892;
    }
LAB_0081550b:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00815519;
  case StringWTF8AdvanceId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_00815892;
    }
LAB_00814e55:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)(pEVar1 + 2));
    goto LAB_008153e0;
  case StringWTF16GetId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00815892;
    }
    goto LAB_008153e0;
  case StringIterNextId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_00815892;
    }
LAB_0081543a:
    pEVar1 = pEVar1 + 1;
LAB_00815519:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_00815892;
    }
LAB_0081545b:
    currp_00 = pEVar1 + 2;
LAB_00815466:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00815519;
  case StringSliceWTFId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00815892;
    }
LAB_008149d8:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00815466;
  case StringSliceIterId:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_00815892;
    }
LAB_008153e0:
    Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
              ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)self,
               wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
               scan(Poppifier*,wasm::Expression___,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00815519;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }